

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyManager::Scan
          (DependencyManager *this,ClientContext *context,
          function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
          *callback)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  mutex *__mutex;
  __node_base _Var1;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  CatalogTransaction transaction;
  CatalogEntryInfo entry_info;
  catalog_entry_set_t entries;
  
  CatalogTransaction::CatalogTransaction(&transaction,&this->catalog->super_Catalog,context);
  __mutex = &this->catalog->write_lock;
  ::std::mutex::lock(__mutex);
  entries._M_h._M_buckets = &entries._M_h._M_single_bucket;
  entries._M_h._M_bucket_count = 1;
  entries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  entries._M_h._M_element_count = 0;
  entries._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  entries._M_h._M_rehash_policy._M_next_resize = 0;
  entries._M_h._M_single_bucket = (__node_base_ptr)0x0;
  entry_info.schema._M_string_length = 0;
  entry_info.schema.field_2._M_allocated_capacity = 0;
  entry_info.type = INVALID;
  entry_info._1_7_ = 0;
  entry_info.schema._M_dataplus._M_p = (pointer)0x0;
  entry_info._0_8_ = operator_new(0x18);
  *(DependencyManager **)entry_info._0_8_ = this;
  *(CatalogTransaction **)(entry_info._0_8_ + 8) = &transaction;
  *(catalog_entry_set_t **)(entry_info._0_8_ + 0x10) = &entries;
  entry_info.schema.field_2._M_allocated_capacity =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:708:31)>
       ::_M_invoke;
  entry_info.schema._M_string_length =
       (size_type)
       ::std::
       _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:708:31)>
       ::_M_manager;
  transaction_00.context.ptr = transaction.context.ptr;
  transaction_00.db.ptr = transaction.db.ptr;
  transaction_00.transaction.ptr = transaction.transaction.ptr;
  transaction_00.transaction_id = transaction.transaction_id;
  transaction_00.start_time = transaction.start_time;
  CatalogSet::Scan(&this->dependents,transaction_00,
                   (function<void_(duckdb::CatalogEntry_&)> *)&entry_info);
  ::std::_Function_base::~_Function_base((_Function_base *)&entry_info);
  for (_Var1 = entries._M_h._M_before_begin; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    GetLookupProperties(&entry_info,(CatalogEntry *)_Var1._M_nxt[1]._M_nxt);
    local_f8 = (code *)0x0;
    pcStack_f0 = (code *)0x0;
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    local_108._M_unused._M_object = operator_new(0x20);
    *(DependencyManager **)local_108._M_unused._0_8_ = this;
    *(CatalogTransaction **)((long)local_108._M_unused._0_8_ + 8) = &transaction;
    *(function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
      **)((long)local_108._M_unused._0_8_ + 0x10) = callback;
    *(_Hash_node_base **)((long)local_108._M_unused._0_8_ + 0x18) = _Var1._M_nxt + 1;
    pcStack_f0 = ::std::
                 _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:717:43)>
                 ::_M_invoke;
    local_f8 = ::std::
               _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:717:43)>
               ::_M_manager;
    transaction_01.context.ptr = transaction.context.ptr;
    transaction_01.db.ptr = transaction.db.ptr;
    transaction_01.transaction.ptr = transaction.transaction.ptr;
    transaction_01.transaction_id = transaction.transaction_id;
    transaction_01.start_time = transaction.start_time;
    ScanSetInternal(this,transaction_01,&entry_info,false,(dependency_callback_t *)&local_108);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_108);
    CatalogEntryInfo::~CatalogEntryInfo(&entry_info);
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&entries._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void DependencyManager::Scan(
    ClientContext &context,
    const std::function<void(CatalogEntry &, CatalogEntry &, const DependencyDependentFlags &)> &callback) {
	auto transaction = catalog.GetCatalogTransaction(context);
	lock_guard<mutex> write_lock(catalog.GetWriteLock());

	// All the objects registered in the dependency manager
	catalog_entry_set_t entries;
	dependents.Scan(transaction, [&](CatalogEntry &set) {
		auto entry = LookupEntry(transaction, set);
		entries.insert(*entry);
	});

	// For every registered entry, get the dependents
	for (auto &entry : entries) {
		auto entry_info = GetLookupProperties(entry);
		// Scan all the dependents of the entry
		ScanDependents(transaction, entry_info, [&](DependencyEntry &dependent) {
			auto dep = LookupEntry(transaction, dependent);
			if (!dep) {
				return;
			}
			auto &dependent_entry = *dep;
			callback(entry, dependent_entry, dependent.Dependent().flags);
		});
	}
}